

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChElementHexaANCF_3813.cpp
# Opt level: O3

void __thiscall
chrono::fea::ChElementHexaANCF_3813::ComputeKRMmatricesGlobal(ChElementHexaANCF_3813 *this)

{
  ChMatrixRef *in_RSI;
  double in_XMM0_Qa;
  double in_XMM1_Qa;
  double in_XMM2_Qa;
  
  ComputeKRMmatricesGlobal
            ((ChElementHexaANCF_3813 *)&this[-1].field_0x4a78,in_RSI,in_XMM0_Qa,in_XMM1_Qa,
             in_XMM2_Qa);
  return;
}

Assistant:

void ChElementHexaANCF_3813::ComputeKRMmatricesGlobal(ChMatrixRef H, double Kfactor, double Rfactor, double Mfactor) {
    assert((H.rows() == 24) && (H.cols() == 24));

    // Compute global stiffness matrix:
    ComputeStiffnessMatrix();

    // For K stiffness matrix and R matrix: scale by factors
    // because [R] = r*[K] , so kf*[K]+rf*[R] = (kf+rf*r)*[K]
    double kr_factor = Kfactor + Rfactor * m_Material->Get_RayleighDampingK();

    // Paste scaled K stiffness matrix and R matrix in resulting H and add scaled mass matrix.
    H.block(0, 0, 24, 24) = kr_factor * m_StiffnessMatrix + Mfactor * m_MassMatrix;
}